

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchableObjectHolder.hpp
# Opt level: O2

shared_ptr<helics::Core> __thiscall
gmlc::concurrency::SearchableObjectHolder<helics::Core,_helics::CoreType>::findObject
          (SearchableObjectHolder<helics::Core,_helics::CoreType> *this,string *name)

{
  iterator iVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  key_type *extraout_RDX;
  shared_ptr<helics::Core> sVar2;
  
  if ((*(byte *)name[4]._M_string_length & 1) == 0) {
    CLI::std::mutex::lock((mutex *)name);
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Core>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Core>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Core>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Core>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Core>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::Core>_>_>_>
                    *)&name[1]._M_string_length,(key_type *)in_RDX._M_pi);
    if (iVar1._M_node == (_Base_ptr)&name[1].field_2) {
      (this->mapLock).super___mutex_base._M_mutex.__align = 0;
      *(undefined8 *)((long)&(this->mapLock).super___mutex_base._M_mutex + 8) = 0;
    }
    else {
      CLI::std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *)(iVar1._M_node + 2));
    }
    pthread_mutex_unlock((pthread_mutex_t *)name);
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX;
  }
  else {
    (this->mapLock).super___mutex_base._M_mutex.__align = 0;
    *(undefined8 *)((long)&(this->mapLock).super___mutex_base._M_mutex + 8) = 0;
  }
  sVar2.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar2.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<helics::Core>)
         sVar2.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<X> findObject(const std::string& name)
    {
#ifdef ENABLE_TRIPWIRE
        if (trippedDetect.isTripped()) {
            return nullptr;
        }
#endif
        std::lock_guard<std::mutex> lock(mapLock);
        auto fnd = objectMap.find(name);
        if (fnd != objectMap.end()) {
            return fnd->second;
        }
        return nullptr;
    }